

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::RelationalComparisonHelper
               (Var aLeft,Var aRight,ScriptContext *scriptContext,bool leftFirst,bool undefinedAs)

{
  ulong uVar1;
  long lVar2;
  code *pcVar3;
  double dVar4;
  bool bVar5;
  byte bVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  RecyclableObject *pRVar9;
  JavascriptTypedNumber<unsigned_long> *pJVar10;
  JavascriptTypedNumber<long> *pJVar11;
  Type TVar12;
  Type TVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double local_58;
  double local_38;
  
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_0099669d:
  if ((undefined1 *)aLeft == (undefined1 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_00996fa2;
    *puVar8 = 0;
  }
  bVar5 = TaggedInt::Is(aLeft);
  if (aLeft < (undefined1 *)0x4000000000000 && !bVar5) {
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00996fa2;
      *puVar8 = 0;
    }
    TVar13 = ((pRVar9->type).ptr)->typeId;
    if ((0x57 < (int)TVar13) && (BVar7 = RecyclableObject::IsExternal(pRVar9), BVar7 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar5) goto LAB_00996fa2;
      *puVar8 = 0;
    }
    if (TVar13 == TypeIds_Undefined) {
      aLeft = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
              super_JavascriptLibraryBase).nan.ptr;
    }
    else if (TVar13 == TypeIds_Null) {
      aLeft = &DAT_1000000000000;
    }
  }
  if ((undefined1 *)aRight == (undefined1 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_00996fa2;
    *puVar8 = 0;
  }
  bVar5 = TaggedInt::Is(aRight);
  if (aRight < (undefined1 *)0x4000000000000 && !bVar5) {
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00996fa2;
      *puVar8 = 0;
    }
    TVar13 = ((pRVar9->type).ptr)->typeId;
    if ((0x57 < (int)TVar13) && (BVar7 = RecyclableObject::IsExternal(pRVar9), BVar7 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar5) goto LAB_00996fa2;
      *puVar8 = 0;
    }
    if (TVar13 == TypeIds_Undefined) {
      aRight = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).nan.ptr;
    }
    else if (TVar13 == TypeIds_Null) {
      aRight = &DAT_1000000000000;
    }
  }
  if ((undefined1 *)aLeft == (undefined1 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_00996fa2;
    *puVar8 = 0;
  }
  bVar5 = TaggedInt::Is(aLeft);
  TVar13 = TypeIds_FirstNumberType;
  if ((!bVar5) && (TVar13 = TypeIds_Number, aLeft < (undefined1 *)0x4000000000000)) {
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00996fa2;
      *puVar8 = 0;
    }
    TVar13 = ((pRVar9->type).ptr)->typeId;
    if ((0x57 < (int)TVar13) && (BVar7 = RecyclableObject::IsExternal(pRVar9), BVar7 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar5) goto LAB_00996fa2;
      *puVar8 = 0;
    }
  }
  if ((undefined1 *)aRight == (undefined1 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar5) goto LAB_00996fa2;
    *puVar8 = 0;
  }
  bVar5 = TaggedInt::Is(aRight);
  TVar12 = TypeIds_FirstNumberType;
  if ((!bVar5) && (TVar12 = TypeIds_Number, aRight < (undefined1 *)0x4000000000000)) {
    pRVar9 = UnsafeVarTo<Js::RecyclableObject>(aRight);
    if (pRVar9 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00996fa2;
      *puVar8 = 0;
    }
    TVar12 = ((pRVar9->type).ptr)->typeId;
    if ((0x57 < (int)TVar12) && (BVar7 = RecyclableObject::IsExternal(pRVar9), BVar7 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar5) goto LAB_00996fa2;
      *puVar8 = 0;
    }
  }
  if ((TVar13 == TypeIds_BigInt) || (TVar12 == TypeIds_BigInt)) {
    if (TVar13 != TVar12) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x28c,"(leftType == rightType)",
                                  "do not support comparison with types other than BigInt");
      if (!bVar5) {
LAB_00996fa2:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    bVar6 = JavascriptBigInt::LessThan(aLeft,aRight);
    goto LAB_00996e39;
  }
  switch(TVar13) {
  case TypeIds_Undefined:
  case TypeIds_Null:
  case TypeIds_Boolean:
  case TypeIds_Symbol:
LAB_00996bf5:
    local_58 = JavascriptConversion::ToNumber(aLeft,scriptContext);
LAB_00996c0c:
    dVar4 = JavascriptConversion::ToNumber(aRight,scriptContext);
    uVar14 = SUB84(dVar4,0);
    uVar15 = (undefined4)((ulong)dVar4 >> 0x20);
LAB_00996c11:
    local_38 = (double)CONCAT44(uVar15,uVar14);
LAB_00996c1e:
    BVar7 = JavascriptNumber::IsNan(local_58);
    bVar6 = undefinedAs;
    if ((BVar7 == 0) && (BVar7 = JavascriptNumber::IsNan(local_38), BVar7 == 0)) {
      if ((local_58 != local_38) || (NAN(local_58) || NAN(local_38))) {
        bVar6 = local_58 < local_38;
      }
      else {
        bVar6 = 0;
      }
    }
LAB_00996e39:
    return (BOOL)bVar6;
  case TypeIds_FirstNumberType:
    local_58 = (double)(int)aLeft;
    break;
  case TypeIds_Number:
    local_58 = JavascriptNumber::GetValue(aLeft);
    break;
  case TypeIds_Int64Number:
    if (TVar12 == TypeIds_LastNumberType) {
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
      uVar1 = pJVar11->m_value;
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight);
      if ((-1 < (long)uVar1) && (bVar6 = uVar1 < pJVar10->m_value, pJVar10->m_value >> 0x1f == 0))
      goto LAB_00996e39;
    }
    else if (TVar12 == TypeIds_Int64Number) {
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
      lVar2 = pJVar11->m_value;
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
      bVar6 = lVar2 < pJVar11->m_value;
      goto LAB_00996e39;
    }
    pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aLeft);
    local_58 = (double)pJVar11->m_value;
    goto LAB_00996c0c;
  case TypeIds_LastNumberType:
    if (TVar12 == TypeIds_LastNumberType) {
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
      uVar1 = pJVar10->m_value;
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aRight);
      bVar6 = uVar1 < pJVar10->m_value;
      goto LAB_00996e39;
    }
    if (TVar12 == TypeIds_Int64Number) {
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
      uVar1 = pJVar10->m_value;
      pJVar11 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aRight);
      if ((uVar1 < 0x7fffffff) && (bVar6 = uVar1 < (ulong)pJVar11->m_value, -1 < pJVar11->m_value))
      goto LAB_00996e39;
    }
    pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aLeft);
    local_58 = ((double)CONCAT44(0x43300000,(int)pJVar10->m_value) - 4503599627370496.0) +
               ((double)CONCAT44(0x45300000,(int)(pJVar10->m_value >> 0x20)) -
               1.9342813113834067e+25);
    goto LAB_00996c0c;
  case TypeIds_String:
    if (TVar12 - TypeIds_Boolean < 3) goto LAB_00996bf5;
    if (TVar12 == TypeIds_String) {
LAB_00996ddd:
      bVar6 = JavascriptString::LessThan(aLeft,aRight);
      goto LAB_00996e39;
    }
    aRight = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aRight,scriptContext);
    if ((undefined1 *)aRight == (undefined1 *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar5) goto LAB_00996fa2;
      *puVar8 = 0;
    }
    bVar5 = TaggedInt::Is(aRight);
    if (aRight < (undefined1 *)0x4000000000000 && !bVar5) {
      pRVar9 = UnsafeVarTo<Js::RecyclableObject>(aRight);
      if (pRVar9 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar5) goto LAB_00996fa2;
        *puVar8 = 0;
      }
      TVar13 = ((pRVar9->type).ptr)->typeId;
      if ((int)TVar13 < 0x58) {
        if (TVar13 == TypeIds_String) goto LAB_00996ddd;
      }
      else {
        BVar7 = RecyclableObject::IsExternal(pRVar9);
        if (BVar7 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar5) goto LAB_00996fa2;
          *puVar8 = 0;
        }
      }
    }
    JavascriptConversion::ToNumber(aRight,scriptContext);
    goto LAB_00996bf5;
  default:
    goto switchD_00996bed_default;
  }
  if (TVar12 == TypeIds_Number) {
    dVar4 = JavascriptNumber::GetValue(aRight);
    uVar14 = SUB84(dVar4,0);
    uVar15 = (undefined4)((ulong)dVar4 >> 0x20);
    goto LAB_00996c11;
  }
  if (TVar12 == TypeIds_FirstNumberType) {
    local_38 = (double)(int)aRight;
  }
  else {
    local_38 = JavascriptConversion::ToNumber(aRight,scriptContext);
  }
  goto LAB_00996c1e;
switchD_00996bed_default:
  if (leftFirst) {
    aLeft = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aLeft,scriptContext);
    aRight = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aRight,scriptContext);
  }
  else {
    aRight = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aRight,scriptContext);
    aLeft = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>(aLeft,scriptContext);
  }
  goto LAB_0099669d;
}

Assistant:

BOOL JavascriptOperators::RelationalComparisonHelper(Var aLeft, Var aRight, ScriptContext* scriptContext, bool leftFirst, bool undefinedAs)
    {
        TypeId typeId = JavascriptOperators::GetTypeId(aLeft);

        if (typeId == TypeIds_Null)
        {
            aLeft=TaggedInt::ToVarUnchecked(0);
        }
        else if (typeId == TypeIds_Undefined)
        {
            aLeft=scriptContext->GetLibrary()->GetNaN();
        }

        typeId = JavascriptOperators::GetTypeId(aRight);

        if (typeId == TypeIds_Null)
        {
            aRight=TaggedInt::ToVarUnchecked(0);
        }
        else if (typeId == TypeIds_Undefined)
        {
            aRight=scriptContext->GetLibrary()->GetNaN();
        }

        double dblLeft, dblRight;
        TypeId leftType = JavascriptOperators::GetTypeId(aLeft);
        TypeId rightType = JavascriptOperators::GetTypeId(aRight);

        if ((leftType == TypeIds_BigInt) || (rightType == TypeIds_BigInt))
        {
            // TODO: support comparison with types other than BigInt
            AssertOrFailFastMsg(leftType == rightType, "do not support comparison with types other than BigInt");
            return JavascriptBigInt::LessThan(aLeft, aRight);
        }

        switch (leftType)
        {
        case TypeIds_Integer:
            dblLeft = TaggedInt::ToDouble(aLeft);
            switch (rightType)
            {
            case TypeIds_Integer:
                dblRight = TaggedInt::ToDouble(aRight);
                break;
            case TypeIds_Number:
                dblRight = JavascriptNumber::GetValue(aRight);
                break;
            default:
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
                break;
            }
            break;
        case TypeIds_Number:
            dblLeft = JavascriptNumber::GetValue(aLeft);
            switch (rightType)
            {
            case TypeIds_Integer:
                dblRight = TaggedInt::ToDouble(aRight);
                break;
            case TypeIds_Number:
                dblRight = JavascriptNumber::GetValue(aRight);
                break;
            default:
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
                break;
            }
            break;
        case TypeIds_Int64Number:
            {
                switch (rightType)
                {
                case TypeIds_Int64Number:
                    {
                        __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                        __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                        return leftValue < rightValue;
                    }
                    break;
                case TypeIds_UInt64Number:
                    {
                        __int64 leftValue = UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                        unsigned __int64 rightValue = UnsafeVarTo<JavascriptUInt64Number>(aRight)->GetValue();
                        if (rightValue <= INT_MAX && leftValue >= 0)
                        {
                            return leftValue < (__int64)rightValue;
                        }
                    }
                    break;
                }
                dblLeft = (double)UnsafeVarTo<JavascriptInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            }
            break;

        // we cannot do double conversion between 2 int64 numbers as we can get wrong result after conversion
        // i.e., two different numbers become the same after losing precision. We'll continue dbl comparison
        // if either number is not an int64 number.
        case TypeIds_UInt64Number:
            {
                switch (rightType)
                {
                case TypeIds_Int64Number:
                    {
                        unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                        __int64 rightValue = UnsafeVarTo<JavascriptInt64Number>(aRight)->GetValue();
                        if (leftValue < INT_MAX && rightValue >= 0)
                        {
                            return (__int64)leftValue < rightValue;
                        }
                    }
                    break;
                case TypeIds_UInt64Number:
                    {
                        unsigned __int64 leftValue = UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                        unsigned __int64 rightValue = UnsafeVarTo<JavascriptUInt64Number>(aRight)->GetValue();
                        return leftValue < rightValue;
                    }
                    break;
                }
                dblLeft = (double)UnsafeVarTo<JavascriptUInt64Number>(aLeft)->GetValue();
                dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            }
            break;

        case TypeIds_String:
            switch (rightType)
            {
            case TypeIds_Integer:
            case TypeIds_Number:
            case TypeIds_Boolean:
                break;
            default:
                aRight = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aRight, scriptContext);
                rightType = JavascriptOperators::GetTypeId(aRight);
                if (rightType != TypeIds_String)
                {
                    dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
                    break;
                }
            case TypeIds_String:
                return JavascriptString::LessThan(aLeft, aRight);
            }
            dblLeft = JavascriptConversion::ToNumber(aLeft, scriptContext);
            dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            break;
        case TypeIds_Boolean:
        case TypeIds_Null:
        case TypeIds_Undefined:
        case TypeIds_Symbol:
            dblLeft = JavascriptConversion::ToNumber(aLeft, scriptContext);
            dblRight = JavascriptConversion::ToNumber(aRight, scriptContext);
            break;
        default:
            if (leftFirst)
            {
                aLeft = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aLeft, scriptContext);
                aRight = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aRight, scriptContext);
            }
            else
            {
                aRight = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aRight, scriptContext);
                aLeft = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(aLeft, scriptContext);
            }
            //BugFix: When @@ToPrimitive of an object is overridden with a function that returns null/undefined
            //this helper will fall into a inescapable goto loop as the checks for null/undefined were outside of the path
            return RelationalComparisonHelper(aLeft, aRight, scriptContext, leftFirst, undefinedAs);
        }

        //
        // And +0,-0 that is not implemented fully
        //

        if (JavascriptNumber::IsNan(dblLeft) || JavascriptNumber::IsNan(dblRight))
        {
            return undefinedAs;
        }

        // this will succeed for -0.0 == 0.0 case as well
        if (dblLeft == dblRight)
        {
            return false;
        }

        return dblLeft < dblRight;
    }